

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_multi.cc
# Opt level: O0

void update_min_count(log_multi *b,uint32_t node)

{
  uint uVar1;
  uint32_t uVar2;
  node *pnVar3;
  uint in_ESI;
  log_multi *in_RDI;
  uint32_t prev;
  node *in_stack_ffffffffffffffd8;
  log_multi *b_00;
  uint local_c;
  
  local_c = in_ESI;
  while( true ) {
    if (local_c == 0) {
      return;
    }
    pnVar3 = v_array<node>::operator[](&in_RDI->nodes,(ulong)local_c);
    uVar1 = pnVar3->parent;
    pnVar3 = v_array<node>::operator[](&in_RDI->nodes,(ulong)uVar1);
    uVar2 = pnVar3->min_count;
    pnVar3 = v_array<node>::operator[](&in_RDI->nodes,(ulong)local_c);
    if (uVar2 == pnVar3->min_count) break;
    b_00 = in_RDI;
    v_array<node>::operator[](&in_RDI->nodes,(ulong)uVar1);
    uVar2 = min_left_right(b_00,in_stack_ffffffffffffffd8);
    pnVar3 = v_array<node>::operator[](&in_RDI->nodes,(ulong)uVar1);
    pnVar3->min_count = uVar2;
    local_c = uVar1;
  }
  return;
}

Assistant:

inline void update_min_count(log_multi& b, uint32_t node)
{
  // Constant time min count update.
  while (node != 0)
  {
    uint32_t prev = node;
    node = b.nodes[node].parent;

    if (b.nodes[node].min_count == b.nodes[prev].min_count)
      break;
    else
      b.nodes[node].min_count = min_left_right(b, b.nodes[node]);
  }
}